

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O1

bilingual_str *
operator+(bilingual_str *__return_storage_ptr__,bilingual_str lhs,bilingual_str *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  pointer pcVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 *in_RDX;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&rhs->original,(char *)*in_RDX,in_RDX[1]);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (&rhs->translated,(char *)in_RDX[4],in_RDX[5]);
  paVar1 = &(__return_storage_ptr__->original).field_2;
  (__return_storage_ptr__->original)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (rhs->original)._M_dataplus._M_p;
  paVar2 = &(rhs->original).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined4 *)((long)&(rhs->original).field_2 + 4);
    uVar6 = *(undefined4 *)((long)&(rhs->original).field_2 + 8);
    uVar7 = *(undefined4 *)((long)&(rhs->original).field_2 + 0xc);
    *(undefined4 *)paVar1 = *(undefined4 *)paVar2;
    *(undefined4 *)((long)&(__return_storage_ptr__->original).field_2 + 4) = uVar5;
    *(undefined4 *)((long)&(__return_storage_ptr__->original).field_2 + 8) = uVar6;
    *(undefined4 *)((long)&(__return_storage_ptr__->original).field_2 + 0xc) = uVar7;
  }
  else {
    (__return_storage_ptr__->original)._M_dataplus._M_p = pcVar4;
    (__return_storage_ptr__->original).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity
    ;
  }
  (__return_storage_ptr__->original)._M_string_length = (rhs->original)._M_string_length;
  (rhs->original)._M_dataplus._M_p = (pointer)paVar2;
  (rhs->original)._M_string_length = 0;
  (rhs->original).field_2._M_local_buf[0] = '\0';
  paVar1 = &(__return_storage_ptr__->translated).field_2;
  (__return_storage_ptr__->translated)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (rhs->translated)._M_dataplus._M_p;
  paVar2 = &(rhs->translated).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined4 *)((long)&(rhs->translated).field_2 + 4);
    uVar6 = *(undefined4 *)((long)&(rhs->translated).field_2 + 8);
    uVar7 = *(undefined4 *)((long)&(rhs->translated).field_2 + 0xc);
    *(undefined4 *)paVar1 = *(undefined4 *)paVar2;
    *(undefined4 *)((long)&(__return_storage_ptr__->translated).field_2 + 4) = uVar5;
    *(undefined4 *)((long)&(__return_storage_ptr__->translated).field_2 + 8) = uVar6;
    *(undefined4 *)((long)&(__return_storage_ptr__->translated).field_2 + 0xc) = uVar7;
  }
  else {
    (__return_storage_ptr__->translated)._M_dataplus._M_p = pcVar4;
    (__return_storage_ptr__->translated).field_2._M_allocated_capacity =
         paVar2->_M_allocated_capacity;
  }
  (__return_storage_ptr__->translated)._M_string_length = (rhs->translated)._M_string_length;
  (rhs->translated)._M_dataplus._M_p = (pointer)paVar2;
  (rhs->translated)._M_string_length = 0;
  (rhs->translated).field_2._M_local_buf[0] = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline bilingual_str operator+(bilingual_str lhs, const bilingual_str& rhs)
{
    lhs += rhs;
    return lhs;
}